

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

void __thiscall Lexer::skip(Lexer *this,char ch,char left,char right)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  
  if (ch == left) {
    cVar6 = (char)this + '(';
    iVar7 = 1;
    do {
      cVar1 = this->yychar;
      bVar5 = true;
      if (cVar1 != '\0') {
        std::__cxx11::string::push_back(cVar6);
        pcVar4 = (this->yypos)._M_current;
        if (pcVar4 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
          this->yychar = '\0';
        }
        else {
          (this->yypos)._M_current = pcVar4 + 1;
          cVar2 = *pcVar4;
          this->yychar = cVar2;
          if (cVar2 == '\n') {
            this->yylineno = this->yylineno + 1;
          }
        }
        if (this->yychar == '/' && cVar1 == '/') {
          while ((this->yychar != '\0' && (this->yychar != '\n'))) {
            std::__cxx11::string::push_back(cVar6);
            pcVar4 = (this->yypos)._M_current;
            if (pcVar4 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
              this->yychar = '\0';
            }
            else {
              (this->yypos)._M_current = pcVar4 + 1;
              cVar1 = *pcVar4;
              this->yychar = cVar1;
              if (cVar1 == '\n') {
                this->yylineno = this->yylineno + 1;
              }
            }
          }
        }
        else if (this->yychar == '*' && cVar1 == '/') {
          std::__cxx11::string::push_back(cVar6);
          pcVar4 = (this->yypos)._M_current;
          if (pcVar4 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
            this->yychar = '\0';
          }
          else {
            (this->yypos)._M_current = pcVar4 + 1;
            cVar1 = *pcVar4;
            this->yychar = cVar1;
            if (cVar1 == '\n') {
              this->yylineno = this->yylineno + 1;
            }
          }
          do {
            cVar1 = this->yychar;
            if (cVar1 == '\0') goto LAB_0010d9cc;
            std::__cxx11::string::push_back(cVar6);
            pcVar4 = (this->yypos)._M_current;
            if (pcVar4 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
              this->yychar = '\0';
            }
            else {
              (this->yypos)._M_current = pcVar4 + 1;
              cVar2 = *pcVar4;
              this->yychar = cVar2;
              if (cVar2 == '\n') {
                this->yylineno = this->yylineno + 1;
              }
            }
          } while (this->yychar != '/' || cVar1 != '*');
          std::__cxx11::string::push_back(cVar6);
          pcVar4 = (this->yypos)._M_current;
          if (pcVar4 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
            this->yychar = '\0';
          }
          else {
            (this->yypos)._M_current = pcVar4 + 1;
            cVar1 = *pcVar4;
            this->yychar = cVar1;
            if (cVar1 == '\n') {
              this->yylineno = this->yylineno + 1;
            }
          }
        }
        else {
          if (cVar1 == left) {
            iVar7 = iVar7 + 1;
          }
          else if ((cVar1 == right) && (iVar7 = iVar7 + -1, iVar7 == 0)) {
            iVar7 = 0;
            goto LAB_0010d9ce;
          }
          if ((cVar1 == '\'') || (cVar1 == '\"')) {
            cVar2 = this->yychar;
            while (cVar2 != '\0') {
              std::__cxx11::string::push_back(cVar6);
              pcVar4 = (this->yypos)._M_current;
              if (pcVar4 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
                this->yychar = '\0';
              }
              else {
                (this->yypos)._M_current = pcVar4 + 1;
                cVar3 = *pcVar4;
                this->yychar = cVar3;
                if (cVar3 == '\n') {
                  this->yylineno = this->yylineno + 1;
                }
              }
              if (cVar2 == cVar1) break;
              if (this->yychar != '\0' && cVar2 == '\\') {
                std::__cxx11::string::push_back(cVar6);
                pcVar4 = (this->yypos)._M_current;
                if (pcVar4 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
                  this->yychar = '\0';
                }
                else {
                  (this->yypos)._M_current = pcVar4 + 1;
                  cVar2 = *pcVar4;
                  this->yychar = cVar2;
                  if (cVar2 == '\n') {
                    this->yylineno = this->yylineno + 1;
                  }
                }
              }
              cVar2 = this->yychar;
            }
            bVar5 = false;
            goto LAB_0010d9ce;
          }
        }
LAB_0010d9cc:
        bVar5 = false;
      }
LAB_0010d9ce:
    } while (!bVar5);
  }
  return;
}

Assistant:

void Lexer::skip(char ch, char left, char right) {
  if (ch == left) {
    int count = 1;
    auto yynext = [this] {
      yytext += yychar;
      yyinp();
    };
    while (auto ch = yychar) {
      yynext();
      if (ch == '/' && yychar == '/') {
        while (yychar && yychar != '\n') yynext();
        continue;
      }
      if (ch == '/' && yychar == '*') {
        yynext();
        while (auto ch = yychar) {
          yynext();
          if (ch == '*' && yychar == '/') {
            yynext();
            break;
          }
        }
        continue;
      }
      if (ch == left) {
        ++count;
      } else if (ch == right) {
        if (!--count) break;
      }
      if (ch == '"' || ch == '\'') {
        auto quote = ch;
        while (auto ch = yychar) {
          yynext();
          if (ch == quote) break;
          if (ch == '\\' && yychar) yynext();
        }
      }
    }
  }
}